

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gb_Apu.cpp
# Opt level: O0

void __thiscall Gb_Apu::write_register(Gb_Apu *this,blip_time_t time,uint addr,int data)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  uint addr_00;
  uint uVar4;
  uint in_ECX;
  uint data_00;
  uint uVar5;
  int iVar6;
  uint in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  int index;
  uint i_2;
  int amp_1;
  Blip_Buffer *old_output;
  int bits;
  Gb_Osc *osc_1;
  int i_1;
  int flags;
  int mask;
  int amp;
  Gb_Osc *osc;
  int i;
  int old_reg;
  int reg;
  blip_time_t t;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint local_58;
  Gb_Apu *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Gb_Apu *in_stack_ffffffffffffffc0;
  int local_38;
  int local_20;
  undefined4 uVar7;
  
  addr_00 = in_EDX - 0xff10;
  if (addr_00 < 0x30) {
    run_until(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    data_00 = (uint)*(byte *)(in_RDI + 0x208 + (long)(int)addr_00);
    *(byte *)(in_RDI + 0x208 + (long)(int)addr_00) = (byte)in_ECX;
    if (in_EDX < 0xff24) {
      write_osc(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    }
    else if ((in_EDX == 0xff24) && (in_ECX != data_00)) {
      local_20 = 0;
      while( true ) {
        t = (blip_time_t)((ulong)in_RDI >> 0x20);
        if (3 < local_20) break;
        lVar2 = *(long *)(in_RDI + (long)local_20 * 8);
        iVar6 = *(int *)(lVar2 + 0x3c);
        *(undefined4 *)(lVar2 + 0x3c) = 0;
        if (((iVar6 != 0) && (*(int *)(lVar2 + 0x48) != 0)) && (*(long *)(lVar2 + 0x20) != 0)) {
          Blip_Synth<8,_1>::offset
                    ((Blip_Synth<8,_1> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),t,(int)in_RDI,
                     (Blip_Buffer *)0x977aef);
        }
        local_20 = local_20 + 1;
      }
      if (*(long *)(in_RDI + 0x138) != 0) {
        Blip_Synth<8,_1>::offset
                  ((Blip_Synth<8,_1> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                   ,t,(int)in_RDI,(Blip_Buffer *)0x977b32);
      }
      update_volume(in_stack_ffffffffffffffb0);
      if (*(long *)(in_RDI + 0x138) != 0) {
        Blip_Synth<8,_1>::offset
                  ((Blip_Synth<8,_1> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                   ,(blip_time_t)((ulong)in_RDI >> 0x20),(int)in_RDI,(Blip_Buffer *)0x977b6c);
      }
    }
    else if ((in_EDX == 0xff25) || (in_EDX == 0xff26)) {
      uVar5 = 0;
      if ((*(byte *)(in_RDI + 0x21e) & 0x80) != 0) {
        uVar5 = 0xffffffff;
      }
      bVar1 = *(byte *)(in_RDI + 0x21d);
      for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
        lVar2 = *(long *)(in_RDI + (long)local_38 * 8);
        *(uint *)(lVar2 + 0x48) = uVar5 & *(uint *)(lVar2 + 0x48);
        uVar4 = (int)(bVar1 & uVar5) >> ((byte)local_38 & 0x1f);
        lVar3 = *(long *)(lVar2 + 0x20);
        *(uint *)(lVar2 + 0x28) = (int)uVar4 >> 3 & 2U | uVar4 & 1;
        *(undefined8 *)(lVar2 + 0x20) = *(undefined8 *)(lVar2 + (long)*(int *)(lVar2 + 0x28) * 8);
        if (((*(long *)(lVar2 + 0x20) != lVar3) &&
            (iVar6 = *(int *)(lVar2 + 0x3c), *(undefined4 *)(lVar2 + 0x3c) = 0, iVar6 != 0)) &&
           (lVar3 != 0)) {
          Blip_Synth<8,_1>::offset
                    ((Blip_Synth<8,_1> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (blip_time_t)((ulong)in_RDI >> 0x20),(int)in_RDI,(Blip_Buffer *)0x977c96);
        }
      }
      if (((in_EDX == 0xff26) && (in_ECX != data_00)) && ((in_ECX & 0x80) == 0)) {
        uVar7 = 0xff26;
        for (local_58 = 0; local_58 < 0x20; local_58 = local_58 + 1) {
          if (local_58 != 0x16) {
            write_register((Gb_Apu *)CONCAT44(in_ESI,uVar7),in_ECX,addr_00,data_00);
          }
        }
      }
    }
    else if (0xff2f < in_EDX) {
      iVar6 = (in_EDX & 0xf) * 2;
      *(char *)(in_RDI + 0x17c + (long)iVar6) = (char)((int)in_ECX >> 4);
      *(byte *)(in_RDI + 0x17c + (long)(iVar6 + 1)) = (byte)in_ECX & 0xf;
    }
  }
  return;
}

Assistant:

void Gb_Apu::write_register( blip_time_t time, unsigned addr, int data )
{
	require( (unsigned) data < 0x100 );
	
	int reg = addr - start_addr;
	if ( (unsigned) reg >= register_count )
		return;
	
	run_until( time );
	
	int old_reg = regs [reg];
	regs [reg] = data;
	
	if ( addr < vol_reg )
	{
		write_osc( reg / 5, reg, data );
	}
	else if ( addr == vol_reg && data != old_reg ) // global volume
	{
		// return all oscs to 0
		for ( int i = 0; i < osc_count; i++ )
		{
			Gb_Osc& osc = *oscs [i];
			int amp = osc.last_amp;
			osc.last_amp = 0;
			if ( amp && osc.enabled && osc.output )
				other_synth.offset( time, -amp, osc.output );
		}
		
		if ( wave.outputs [3] )
			other_synth.offset( time, 30, wave.outputs [3] );
		
		update_volume();
		
		if ( wave.outputs [3] )
			other_synth.offset( time, -30, wave.outputs [3] );
		
		// oscs will update with new amplitude when next run
	}
	else if ( addr == 0xFF25 || addr == status_reg )
	{
		int mask = (regs [status_reg - start_addr] & 0x80) ? ~0 : 0;
		int flags = regs [0xFF25 - start_addr] & mask;
		
		// left/right assignments
		for ( int i = 0; i < osc_count; i++ )
		{
			Gb_Osc& osc = *oscs [i];
			osc.enabled &= mask;
			int bits = flags >> i;
			Blip_Buffer* old_output = osc.output;
			osc.output_select = (bits >> 3 & 2) | (bits & 1);
			osc.output = osc.outputs [osc.output_select];
			if ( osc.output != old_output )
			{
				int amp = osc.last_amp;
				osc.last_amp = 0;
				if ( amp && old_output )
					other_synth.offset( time, -amp, old_output );
			}
		}
		
		if ( addr == status_reg && data != old_reg )
		{
			if ( !(data & 0x80) )
			{
				for ( unsigned i = 0; i < sizeof powerup_regs; i++ )
				{
					if ( i != status_reg - start_addr )
						write_register( time, i + start_addr, powerup_regs [i] );
				}
			}
			else
			{
				//debug_printf( "APU powered on\n" );
			}
		}
	}
	else if ( addr >= 0xFF30 )
	{
		int index = (addr & 0x0F) * 2;
		wave.wave [index] = data >> 4;
		wave.wave [index + 1] = data & 0x0F;
	}
}